

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_pipeline.cpp
# Opt level: O2

Pipeline * __thiscall duckdb::MetaPipeline::CreatePipeline(MetaPipeline *this)

{
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *this_00;
  PhysicalOperator *pPVar1;
  idx_t iVar2;
  reference pvVar3;
  type pPVar4;
  
  this_00 = &this->pipelines;
  make_shared_ptr<duckdb::Pipeline,duckdb::Executor&>((Executor *)&stack0xffffffffffffffd8);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Pipeline,true>,std::allocator<duckdb::shared_ptr<duckdb::Pipeline,true>>>
  ::emplace_back<duckdb::shared_ptr<duckdb::Pipeline,true>>
            ((vector<duckdb::shared_ptr<duckdb::Pipeline,true>,std::allocator<duckdb::shared_ptr<duckdb::Pipeline,true>>>
              *)this_00,(shared_ptr<duckdb::Pipeline,_true> *)&stack0xffffffffffffffd8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  pvVar3 = vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true>::back(this_00);
  pPVar4 = shared_ptr<duckdb::Pipeline,_true>::operator*(pvVar3);
  pPVar1 = (this->sink).ptr;
  iVar2 = this->next_batch_index;
  this->next_batch_index = iVar2 + 1;
  (pPVar4->sink).ptr = pPVar1;
  pPVar4->base_batch_index = iVar2 * 10000000000000;
  pvVar3 = vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true>::back(this_00);
  pPVar4 = shared_ptr<duckdb::Pipeline,_true>::operator*(pvVar3);
  return pPVar4;
}

Assistant:

Pipeline &MetaPipeline::CreatePipeline() {
	pipelines.emplace_back(make_shared_ptr<Pipeline>(executor));
	state.SetPipelineSink(*pipelines.back(), sink, next_batch_index++);
	return *pipelines.back();
}